

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
deleteNode(UA_Server *server,UA_Session *session,UA_NodeId *nodeId,UA_Boolean deleteReferences)

{
  undefined8 *puVar1;
  _func_void_UA_NodeId_void_ptr *p_Var2;
  UA_ReferenceNode *pUVar3;
  UA_StatusCode UVar4;
  UA_ObjectNode *node;
  UA_ObjectTypeNode *pUVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  UA_DeleteReferencesItem local_b8;
  UA_Session *local_40;
  UA_NodeId *local_38;
  
  local_40 = session;
  node = (UA_ObjectNode *)UA_NodeStore_get(server->nodestore,nodeId);
  if (node == (UA_ObjectNode *)0x0) {
    UVar4 = 0x80340000;
  }
  else {
    if (((node->nodeClass == UA_NODECLASS_OBJECT) &&
        (pUVar5 = getObjectNodeType(server,node), pUVar5 != (UA_ObjectTypeNode *)0x0)) &&
       (p_Var2 = (pUVar5->lifecycleManagement).destructor,
       p_Var2 != (_func_void_UA_NodeId_void_ptr *)0x0)) {
      (*p_Var2)(*nodeId,node->instanceHandle);
    }
    if (deleteReferences) {
      local_b8.targetNodeId.serverIndex = 0;
      local_b8.targetNodeId._44_4_ = 0;
      local_b8.deleteBidirectional = false;
      local_b8._105_7_ = 0;
      local_b8.targetNodeId.namespaceUri.length = 0;
      local_b8.targetNodeId.namespaceUri.data = (UA_Byte *)0x0;
      local_b8.isForward = false;
      local_b8._49_7_ = 0;
      local_b8.referenceTypeId.identifier.string.length = 0;
      local_b8.referenceTypeId.identifier.string.data = (UA_Byte *)0x0;
      local_b8.sourceNodeId.identifier.string.data = (UA_Byte *)0x0;
      local_b8.referenceTypeId.namespaceIndex = 0;
      local_b8.referenceTypeId._2_2_ = 0;
      local_b8.referenceTypeId.identifierType = UA_NODEIDTYPE_NUMERIC;
      local_b8.sourceNodeId.namespaceIndex = 0;
      local_b8.sourceNodeId._2_2_ = 0;
      local_b8.sourceNodeId.identifierType = UA_NODEIDTYPE_NUMERIC;
      local_b8.sourceNodeId.identifier.string.length = 0;
      local_b8.targetNodeId.nodeId.namespaceIndex = (node->nodeId).namespaceIndex;
      local_b8.targetNodeId.nodeId._2_2_ = *(undefined2 *)&(node->nodeId).field_0x2;
      local_b8.targetNodeId.nodeId.identifierType = (node->nodeId).identifierType;
      local_b8.targetNodeId.nodeId.identifier.string.length =
           (node->nodeId).identifier.string.length;
      local_b8.targetNodeId.nodeId.identifier.string.data = (node->nodeId).identifier.string.data;
      lVar6 = 0x20;
      local_38 = nodeId;
      for (uVar7 = 0; nodeId = local_38, uVar7 < node->referencesSize; uVar7 = uVar7 + 1) {
        pUVar3 = node->references;
        local_b8.isForward = *(UA_Boolean *)((long)pUVar3 + lVar6 + -8);
        local_b8.sourceNodeId.identifier.string.data =
             (UA_Byte *)*(undefined8 *)((long)&(pUVar3->referenceTypeId).identifier + lVar6 + 8);
        puVar1 = (undefined8 *)((long)&(pUVar3->referenceTypeId).namespaceIndex + lVar6);
        local_b8.sourceNodeId._0_8_ = *puVar1;
        local_b8.sourceNodeId.identifier.string.length = puVar1[1];
        puVar1 = (undefined8 *)((long)pUVar3 + lVar6 + -0x20);
        local_b8.referenceTypeId._0_8_ = *puVar1;
        local_b8.referenceTypeId.identifier.string.length = puVar1[1];
        local_b8.referenceTypeId.identifier.string.data =
             (UA_Byte *)*(undefined8 *)((long)pUVar3 + lVar6 + -0x10);
        deleteReference(server,local_40,&local_b8);
        lVar6 = lVar6 + 0x50;
      }
    }
    UVar4 = UA_NodeStore_remove(server->nodestore,nodeId);
  }
  return UVar4;
}

Assistant:

static UA_StatusCode
deleteNode(UA_Server *server, UA_Session *session,
           const UA_NodeId *nodeId, UA_Boolean deleteReferences) {
    const UA_Node *node = UA_NodeStore_get(server->nodestore, nodeId);
    if(!node)
        return UA_STATUSCODE_BADNODEIDUNKNOWN;

    /* TODO: check if the information model consistency is violated */
    /* TODO: Check if the node is a mandatory child of an object */

    /* Destroy an object before removing it */
    if(node->nodeClass == UA_NODECLASS_OBJECT) {
        /* Call the destructor from the object type */
        const UA_ObjectTypeNode *typenode = getObjectNodeType(server, (const UA_ObjectNode*)node);
        if(typenode && typenode->lifecycleManagement.destructor)
            typenode->lifecycleManagement.destructor(*nodeId, ((const UA_ObjectNode*)node)->instanceHandle);
    }

    /* Remove references to the node (not the references in the node that will
     * be deleted anyway) */
    if(deleteReferences)
        removeReferences(server, session, node);

    return UA_NodeStore_remove(server->nodestore, nodeId);
}